

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpBroker.cpp
# Opt level: O0

bool __thiscall helics::tcp::TcpBrokerSS::brokerConnect(TcpBrokerSS *this)

{
  bool bVar1;
  byte bVar2;
  pointer __str;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  bool in_stack_0000001f;
  TcpCommsSS *in_stack_00000020;
  string_view in_stack_00000028;
  unique_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffe8;
  NetworkBroker<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0,_11>
  *in_stack_fffffffffffffff0;
  
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)
             CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8
            );
  bVar1 = CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_RDI);
  if (!bVar1) {
    CLI::std::unique_ptr<helics::tcp::TcpCommsSS,_std::default_delete<helics::tcp::TcpCommsSS>_>::
    operator->((unique_ptr<helics::tcp::TcpCommsSS,_std::default_delete<helics::tcp::TcpCommsSS>_> *
               )0x4955fa);
    TcpCommsSS::addConnections((TcpCommsSS *)in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  }
  if (((ulong)in_RDI[0xfa]._M_len & 1) != 0) {
    __str = CLI::std::
            unique_ptr<helics::tcp::TcpCommsSS,_std::default_delete<helics::tcp::TcpCommsSS>_>::
            operator->((unique_ptr<helics::tcp::TcpCommsSS,_std::default_delete<helics::tcp::TcpCommsSS>_>
                        *)0x49564e);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_RDI,(char *)__str);
    TcpCommsSS::setFlag(in_stack_00000020,in_stack_00000028,in_stack_0000001f);
  }
  std::unique_lock<std::mutex>::unlock
            ((unique_lock<std::mutex> *)
             CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  bVar2 = NetworkBroker<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0,_11>::
          brokerConnect(in_stack_fffffffffffffff0);
  std::unique_lock<std::mutex>::~unique_lock
            ((unique_lock<std::mutex> *)CONCAT17(bVar2,in_stack_ffffffffffffffb0));
  return (bool)(bVar2 & 1);
}

Assistant:

bool TcpBrokerSS::brokerConnect()
    {
        std::unique_lock<std::mutex> lock(dataMutex);
        if (!connections.empty()) {
            comms->addConnections(connections);
        }
        if (no_outgoing_connections) {
            comms->setFlag("allow_outgoing", false);
        }
        lock.unlock();
        return NetworkBroker::brokerConnect();
    }